

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx,void *_output)

{
  size_t sVar1;
  int iVar2;
  undefined8 in_RAX;
  int blocklen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  sVar1 = _ctx->algo->tag_size;
  iVar2 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&local_24);
  if (iVar2 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x3a0,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
  }
  iVar2 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,0x10,(int)sVar1,
                              (void *)((long)_output + (long)local_24));
  if (iVar2 != 0) {
    return sVar1 + (long)local_24;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                ,0x3a3,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
}

Assistant:

static size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx, void *_output)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    ret = EVP_EncryptFinal_ex(ctx->evp_ctx, output + off, &blocklen);
    assert(ret);
    off += blocklen;
    ret = EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_GET_TAG, (int)tag_size, output + off);
    assert(ret);
    off += tag_size;

    return off;
}